

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,
          unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
          *v)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m_);
  if (this->closed_ == false) {
    std::
    deque<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>,std::allocator<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>>
    ::
    emplace_back<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>
              ((deque<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>,std::allocator<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>>
                *)&this->write_,v);
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void pushRead(std::unique_ptr<T> v) {
    std::unique_lock<std::mutex> lock(m_);
    if (!closed_) {
      write_.push_back(std::move(v));
      cv_.notify_one();
    }
  }